

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * anon_unknown.dwarf_f89de::CreateLoad
                    (ExpressionContext *ctx,VmModule *module,SynBase *source,TypeBase *type,
                    VmValue *address,uint offset)

{
  uint uVar1;
  ulong size;
  Allocator *allocator;
  VariableData *pVVar2;
  int iVar3;
  VmInstructionType VVar4;
  VmConstant *pVVar5;
  undefined4 extraout_var;
  VmInstruction *pVVar6;
  TypeBase *pTVar7;
  SynBase *source_00;
  undefined1 auVar8 [16];
  VmType VVar9;
  int in_stack_ffffffffffffffb8;
  VmConstant *reference;
  VmConstant *this;
  
  size = type->size;
  if (size == 0) {
    pVVar5 = CreateConstantStruct(ctx->allocator,source,(char *)0x0,0,type);
    return &pVVar5->super_VmValue;
  }
  if (0x40 < (long)size) {
    pVVar5 = CreateAlloca(ctx,module,source,type,"spill",true);
    CreateMemCopy(module,source,&pVVar5->super_VmValue,0,address,(uint)type->size,
                  in_stack_ffffffffffffffb8);
    iVar3 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0xd8);
    this = (VmConstant *)CONCAT44(extraout_var,iVar3);
    allocator = ctx->allocator;
    VVar9 = GetVmType(ctx,type);
    VmConstant::VmConstant(this,allocator,VVar9,source);
    this->iValue = pVVar5->iValue;
    pVVar2 = pVVar5->container;
    this->container = pVVar2;
    this->isReference = true;
    reference = this;
    SmallArray<VmConstant_*,_8U>::push_back(&pVVar2->users,&reference);
    return &reference->super_VmValue;
  }
  auVar8._0_4_ = -(uint)(type == ctx->typeBool);
  auVar8._4_4_ = -(uint)(type == ctx->typeChar);
  auVar8._8_4_ = -(uint)(type == ctx->typeShort);
  auVar8._12_4_ = -(uint)(type == ctx->typeInt);
  iVar3 = movmskps((int)type,auVar8);
  if (iVar3 == 0) {
    source_00 = (SynBase *)0x800000002;
    if (ctx->typeFloat == type) {
      source_00 = (SynBase *)0x800000002;
      pTVar7 = (TypeBase *)0x0;
    }
    else {
      pTVar7 = (TypeBase *)0x0;
      if (ctx->typeDouble != type) {
        if (ctx->typeLong == type) {
          source_00 = (SynBase *)0x800000003;
          pTVar7 = (TypeBase *)0x0;
        }
        else {
          uVar1 = type->typeID;
          pTVar7 = type;
          if (uVar1 == 0x12) {
            source_00 = (SynBase *)0x800000006;
          }
          else if (uVar1 == 0x14) {
            source_00 = (SynBase *)0xc00000008;
          }
          else if (uVar1 == 0x15) {
            source_00 = (SynBase *)0xc00000007;
          }
          else {
            if (ctx->typeAutoRef == (TypeStruct *)type) {
              source_00 = (SynBase *)0xc00000009;
            }
            else if (ctx->typeAutoArray == (TypeStruct *)type) {
              source_00 = (SynBase *)0x100000000a;
            }
            else {
              source_00 = (SynBase *)0x400000001;
              if (1 < uVar1 - 9) {
                pTVar7 = (TypeBase *)0x0;
                if ((uVar1 != 0x19) &&
                   (source_00 = (SynBase *)0x800000006, pTVar7 = type, uVar1 != 0xb)) {
                  if ((size & 3) != 0) {
                    __assert_fail("type->size % 4 == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                  ,0x1e2,
                                  "VmType (anonymous namespace)::GetLoadResultType(ExpressionContext &, TypeBase *)"
                                 );
                  }
                  VVar9 = VmType::Struct(size,type);
                  source_00 = VVar9._0_8_;
                  pTVar7 = VVar9.structType;
                }
                goto LAB_001876f7;
              }
            }
            pTVar7 = (TypeBase *)0x0;
          }
        }
      }
    }
  }
  else {
    source_00 = (SynBase *)0x400000001;
    pTVar7 = (TypeBase *)0x0;
  }
LAB_001876f7:
  VVar4 = GetLoadInstruction(ctx,type);
  pVVar5 = CreateConstantInt(ctx->allocator,source,0);
  VVar9.structType._0_4_ = VVar4;
  VVar9._0_8_ = pTVar7;
  VVar9.structType._4_4_ = 0;
  pVVar6 = CreateInstruction((anon_unknown_dwarf_f89de *)module,(VmModule *)source,source_00,VVar9,
                             (VmInstructionType)address,&pVVar5->super_VmValue,address);
  return &pVVar6->super_VmValue;
}

Assistant:

VmValue* CreateLoad(ExpressionContext &ctx, VmModule *module, SynBase *source, TypeBase *type, VmValue *address, unsigned offset)
	{
		if(type->size == 0)
			return CreateConstantStruct(ctx.allocator, source, NULL, 0, type);

		if(type->size > spillTypeSize)
		{
			VmConstant *spill = CreateAlloca(ctx, module, source, type, "spill", true);

			CreateMemCopy(module, source, spill, 0, address, offset, (int)type->size);

			VmConstant *reference = new (module->get<VmConstant>()) VmConstant(ctx.allocator, GetVmType(ctx, type), source);

			reference->iValue = spill->iValue;
			reference->container = spill->container;
			reference->isReference = true;

			reference->container->users.push_back(reference);

			return reference;
		}

		return CreateInstruction(module, source, GetLoadResultType(ctx, type), GetLoadInstruction(ctx, type), address, CreateConstantInt(ctx.allocator, source, offset));
	}